

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

value_type * __thiscall nonstd::optional_lite::optional<int>::value(optional<int> *this)

{
  bool bVar1;
  bad_optional_access *this_00;
  value_type *pvVar2;
  bad_optional_access local_20;
  optional<int> *local_10;
  optional<int> *this_local;
  
  local_10 = this;
  bVar1 = has_value(this);
  if (!bVar1) {
    this_00 = (bad_optional_access *)__cxa_allocate_exception(0x10);
    bad_optional_access::bad_optional_access(&local_20);
    bad_optional_access::bad_optional_access(this_00,&local_20);
    __cxa_throw(this_00,&bad_optional_access::typeinfo,bad_optional_access::~bad_optional_access);
  }
  pvVar2 = detail::storage_t<int>::value((storage_t<int> *)&(this->contained).data);
  return pvVar2;
}

Assistant:

optional_constexpr14 value_type const & value() const optional_ref_qual
    {
#if optional_CONFIG_NO_EXCEPTIONS
        assert( has_value() );
#else
        if ( ! has_value() )
        {
            throw bad_optional_access();
        }
#endif
        return contained.value();
    }